

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clparser_test.cc
# Opt level: O0

void __thiscall
RegisterCLParserTestParseSimple::RegisterCLParserTestParseSimple
          (RegisterCLParserTestParseSimple *this)

{
  RegisterCLParserTestParseSimple *this_local;
  
  RegisterTest(CLParserTestParseSimple::Create,"CLParserTest.ParseSimple");
  return;
}

Assistant:

TEST(CLParserTest, ParseSimple) {
  CLParser parser;
  string output, err;
  ASSERT_TRUE(parser.Parse(
      "foo\r\n"
      "Note: inc file prefix:  foo.h\r\n"
      "bar\r\n",
      "Note: inc file prefix:", &output, &err));

  ASSERT_EQ("foo\nbar\n", output);
  ASSERT_EQ(1u, parser.includes_.size());
  ASSERT_EQ("foo.h", *parser.includes_.begin());
}